

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# discrete.c
# Opt level: O3

void massagediscblk(Item *q1,Item *q2,Item *q3,Item *q4)

{
  long *plVar1;
  int iVar2;
  Item *pIVar3;
  Item *pIVar4;
  List *pLVar5;
  long lVar6;
  List *pLVar7;
  
  replacstr(q1,"int");
  insertstr(q3,"()\n{\n");
  insertstr(q4,"}\n");
  plVar1 = &((q2->element).sym)->subtype;
  *plVar1 = *plVar1 | 0x1000;
  lVar6 = 0x41;
  do {
    pLVar5 = symlist[lVar6];
    for (pLVar7 = pLVar5->next; pLVar7 != pLVar5; pLVar7 = pLVar7->next) {
      pIVar3 = (pLVar7->element).itm;
      if ((((pIVar3->itemtype == 0x13e) && (((ulong)(pIVar3->element).itm & 0x10) != 0)) &&
          (*(int *)&pIVar3[1].next != 0)) &&
         (iVar2 = *(int *)((long)&pIVar3[1].prev + 4), iVar2 != 0)) {
        if (((ulong)(pIVar3->element).itm & 0x20) == 0) {
          pIVar4 = pIVar3[2].element.itm;
          sprintf(buf,"{int _i; for (_i=%d; _i>0; _i--) __%s[_i] = __%s[_i-1];\n __%s[0] = %s;\n}\n"
                  ,(ulong)(iVar2 - 1),pIVar4,pIVar4,pIVar4,pIVar4);
        }
        else {
          pIVar4 = pIVar3[2].element.itm;
          sprintf(buf,
                  "{int _i, _j; for (_j=%d; _j >=0; _j--) {\nfor (_i=%d; _i>0; _i--) __%s[_i][_j] = __%s[_i-1][_j];\n __%s[0][_j] = %s[_j];\n}}\n"
                  ,(ulong)(*(int *)&pIVar3[1].prev - 1),(ulong)(iVar2 - 1),pIVar4,pIVar4,pIVar4,
                  pIVar4);
        }
        insertstr(q3,buf);
        *(undefined4 *)&pIVar3[1].next = 0;
        pLVar5 = symlist[lVar6];
      }
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x7b);
  movelist(q1,q4,procfunc);
  return;
}

Assistant:

void massagediscblk(q1, q2, q3, q4) /*DISCRETE NAME stmtlist '}'*/
	Item *q1, *q2, *q3, *q4;
{
	int i;
	Symbol *s;
	Item *qs;
	
	replacstr(q1, "int");
	Insertstr(q3, "()\n{\n");
	Insertstr(q4, "}\n");
	SYM(q2)->subtype |= DISCF;
	SYMITER(NAME) if (s->subtype & STAT && s->used && s->discdim) {
		if (s->subtype & ARRAY) {
Sprintf(buf, "{int _i, _j; for (_j=%d; _j >=0; _j--) {\n\
for (_i=%d; _i>0; _i--) __%s[_i][_j] = __%s[_i-1][_j];\n\
 __%s[0][_j] = %s[_j];\n\
}}\n",
			s->araydim -1,
			s->discdim -1, s->name, s->name, s->name, s->name);
		}else{
Sprintf(buf, "{int _i; for (_i=%d; _i>0; _i--) __%s[_i] = __%s[_i-1];\n\
 __%s[0] = %s;\n}\n",
			s->discdim -1, s->name, s->name, s->name, s->name);
		}
		Insertstr(q3, buf);
		s->used = 0;
	}
	/*initialization and declaration done elsewhere*/
	movelist(q1, q4, procfunc);
}